

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::UpdateDefaultConfigPSKc
          (Error *__return_storage_ptr__,JobManager *this,ByteArray *aPSKc)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string local_b0;
  writer write;
  undefined1 local_88 [40];
  parse_func local_60 [1];
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if ((ulong)((long)(aPSKc->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(aPSKc->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < 0x11) {
    iVar2 = (*(((this->mDefaultCommissioner).
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
    if ((char)iVar2 == '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(this->mDefaultConf).mPSKc,aPSKc);
      CommissionerAppCreate((Error *)local_88,&this->mDefaultCommissioner,&this->mDefaultConf);
      this_00 = (string *)(local_88 + 8);
      goto LAB_00140be0;
    }
    local_88._0_4_ = none_type;
    local_88._8_8_ = "cannot set PSKc when the commissioner is active";
    local_88._16_8_ = 0x2f;
    local_88._24_8_ = 0;
    local_60[0] = (parse_func)0x0;
    pcVar3 = "cannot set PSKc when the commissioner is active";
    write.handler_ = (format_string_checker<char> *)local_88;
    local_88._32_8_ = (format_string_checker<char> *)local_88;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar3,"");
          goto LAB_00140b91;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",(format_string_checker<char> *)local_88);
    }
LAB_00140b91:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"cannot set PSKc when the commissioner is active",
               (string_view)ZEXT816(0x2f),args_00);
    local_50._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_b0);
  }
  else {
    local_88._0_4_ = none_type;
    local_88._8_8_ = "invalid PSKc length";
    local_88._16_8_ = 0x13;
    local_88._24_8_ = 0;
    local_60[0] = (parse_func)0x0;
    pcVar3 = "invalid PSKc length";
    local_88._32_8_ = (format_string_checker<char> *)local_88;
    while (pcVar4 = pcVar3, pcVar4 != "") {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",(format_string_checker<char> *)local_88);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"invalid PSKc length",(string_view)ZEXT816(0x13),args);
    local_50._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_b0);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  this_00 = &local_b0;
LAB_00140be0:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::UpdateDefaultConfigPSKc(const ByteArray &aPSKc)
{
    Error error;

    VerifyOrExit(aPSKc.size() <= kMaxPSKcLength, error = ERROR_INVALID_ARGS("invalid PSKc length"));
    VerifyOrExit(!mDefaultCommissioner->IsActive(),
                 error = ERROR_INVALID_STATE("cannot set PSKc when the commissioner is active"));

    mDefaultConf.mPSKc = aPSKc;
    CommissionerAppCreate(mDefaultCommissioner, mDefaultConf).IgnoreError();

exit:
    return error;
}